

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusargument.h
# Opt level: O0

QDBusArgument * operator>>(QDBusArgument *arg,QList<QDBusMenuLayoutItem> *list)

{
  byte bVar1;
  QDBusMenuLayoutItem *in_RSI;
  QDBusArgument *in_RDI;
  long in_FS_OFFSET;
  QDBusMenuLayoutItem item;
  parameter_type in_stack_ffffffffffffffb8;
  undefined1 local_30 [40];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QDBusArgument::beginArray();
  QList<QDBusMenuLayoutItem>::clear((QList<QDBusMenuLayoutItem> *)in_RSI);
  while( true ) {
    bVar1 = QDBusArgument::atEnd();
    if (((bVar1 ^ 0xff) & 1) == 0) break;
    memset(local_30,0xaa,0x28);
    QDBusMenuLayoutItem::QDBusMenuLayoutItem(in_RSI);
    operator>>(in_RDI,in_RSI);
    QList<QDBusMenuLayoutItem>::push_back
              ((QList<QDBusMenuLayoutItem> *)in_RSI,in_stack_ffffffffffffffb8);
    QDBusMenuLayoutItem::~QDBusMenuLayoutItem(in_RSI);
  }
  QDBusArgument::endArray();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

inline const QDBusArgument &operator>>(const QDBusArgument &arg, Container<T> &list)
{
    arg.beginArray();
    list.clear();
    while (!arg.atEnd()) {
        T item;
        arg >> item;
        list.push_back(item);
    }

    arg.endArray();
    return arg;
}